

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeGlobalSet
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Name global)

{
  Name global_00;
  Index pos_00;
  Global *pGVar1;
  Result<wasm::Ok> local_70;
  ParseDefsCtx *local_48;
  char *local_40;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_38;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *pPStack_28;
  Index pos_local;
  ParseDefsCtx *this_local;
  Name global_local;
  
  local_40 = global.super_IString.str._M_str;
  local_48 = global.super_IString.str._M_len;
  local_38 = annotations;
  annotations_local._4_4_ = pos;
  pPStack_28 = this;
  this_local = local_48;
  global_local.super_IString.str._M_len = (size_t)local_40;
  global_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  pGVar1 = Module::getGlobalOrNull(this->wasm,global);
  pos_00 = annotations_local._4_4_;
  if (pGVar1 != (Global *)0x0) {
    global_00.super_IString.str._M_str = (char *)global_local.super_IString.str._M_len;
    global_00.super_IString.str._M_len = (size_t)this_local;
    IRBuilder::makeGlobalSet(&local_70,&this->irBuilder,global_00);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos_00,&local_70);
    Result<wasm::Ok>::~Result(&local_70);
    return __return_storage_ptr__;
  }
  __assert_fail("wasm.getGlobalOrNull(global)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/contexts.h"
                ,0x80a,
                "Result<> wasm::WATParser::ParseDefsCtx::makeGlobalSet(Index, const std::vector<Annotation> &, Name)"
               );
}

Assistant:

Result<> makeGlobalSet(Index pos,
                         const std::vector<Annotation>& annotations,
                         Name global) {
    assert(wasm.getGlobalOrNull(global));
    return withLoc(pos, irBuilder.makeGlobalSet(global));
  }